

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O0

DateData * asl::Date::calc(DateData *__return_storage_ptr__,double t)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int s;
  int m;
  int h;
  double dt;
  int i;
  int yd;
  int leap;
  double t_local;
  
  if (NAN(t)) {
    memset(__return_storage_ptr__,0,0x1c);
  }
  else {
    iVar1 = yearFromTime(t);
    __return_storage_ptr__->year = iVar1;
    iVar1 = yearFromTime(t);
    bVar3 = false;
    if (iVar1 % 4 == 0) {
      iVar1 = yearFromTime(t);
      bVar3 = true;
      if (iVar1 % 100 == 0) {
        iVar1 = yearFromTime(t);
        bVar3 = iVar1 % 400 == 0;
      }
    }
    iVar1 = 0x16d;
    if (bVar3) {
      iVar1 = 0x16e;
    }
    dVar4 = floor(t / 86400.0);
    iVar2 = __return_storage_ptr__->year;
    dVar5 = floor((double)(__return_storage_ptr__->year + -0x7b1) / 4.0);
    dVar6 = floor((double)(__return_storage_ptr__->year + -0x76d) / 100.0);
    dVar7 = floor((double)(__return_storage_ptr__->year + -0x641) / 400.0);
    iVar2 = (int)(dVar4 - ((((double)((iVar2 + -0x7b2) * 0x16d) + dVar5) - dVar6) + dVar7));
    __return_storage_ptr__->month = 1;
    for (dt._4_4_ = iVar2 / 0x20; dt._4_4_ < 0xd; dt._4_4_ = dt._4_4_ + 1) {
      if (iVar2 < *(int *)(month_days +
                          (long)(dt._4_4_ + 1) * 4 + (long)(int)(uint)(iVar1 == 0x16e) * 0x38)) {
        __return_storage_ptr__->month = dt._4_4_;
        break;
      }
    }
    __return_storage_ptr__->day =
         (iVar2 - *(int *)(month_days +
                          (long)__return_storage_ptr__->month * 4 +
                          (long)(int)(uint)(iVar1 == 0x16e) * 0x38)) + 1;
    dVar4 = t + 0.0005;
    dVar5 = floor(dVar4 / 86400.0);
    dVar5 = dVar4 / 86400.0 - dVar5;
    dVar6 = floor(dVar5 * 24.0);
    iVar1 = (int)dVar6;
    dVar6 = floor((dVar5 * 24.0 + -(double)iVar1) * 60.0);
    dVar5 = floor(((dVar5 * 24.0 + -(double)iVar1) * 60.0 + -(double)(int)dVar6) * 60.0);
    __return_storage_ptr__->hours = iVar1;
    __return_storage_ptr__->minutes = (int)dVar6;
    __return_storage_ptr__->seconds = (int)dVar5;
    dVar4 = floor(dVar4 / 86400.0);
    __return_storage_ptr__->weekDay = ((int)dVar4 + -3) % 7;
    if (__return_storage_ptr__->weekDay < 0) {
      __return_storage_ptr__->weekDay = __return_storage_ptr__->weekDay + 7;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

DateData Date::calc(double t)
{
	DateData date;
	if (t != t)
	{
		memset(&date, 0, sizeof(date));
		return date;
	}
	date.year = yearFromTime(t);
	int leap = isLeapYear(t) ? 1 : 0;
	int yd = (int)dayWithinYear(t, date.year);
	date.month = 1;

	for (int i = yd / 32; i < 13; i++)
	{
		if (yd < month_days[leap][i + 1])
		{
			date.month = i;
			break;
		}
	}
	date.day = yd - month_days[leap][date.month] + 1;

	t += 0.0005;
	double dt = ((t / 86400.0) - floor(t / 86400.0));
	int    h = (int)floor(24 * dt);
	int    m = (int)floor((24 * dt - h) * 60);
	int    s = (int)floor(((24 * dt - h) * 60 - m) * 60.0);
	
	date.hours = h;
	date.minutes = m;
	date.seconds = s;
	date.weekDay = ((int)floor(t / 86400.0) - 3) % 7;
	if (date.weekDay < 0)
		date.weekDay += 7;
	return date;
}